

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::BaseBuilder::_newConstPoolNode(BaseBuilder *this,ConstPoolNode **out)

{
  Error EVar1;
  
  *out = (ConstPoolNode *)0x0;
  EVar1 = _newNodeT<asmjit::ConstPoolNode>(this,out);
  if (EVar1 != 0) {
    return EVar1;
  }
  EVar1 = registerLabelNode(this,&(*out)->super_LabelNode);
  return EVar1;
}

Assistant:

Error BaseBuilder::_newConstPoolNode(ConstPoolNode** out) {
  *out = nullptr;

  ASMJIT_PROPAGATE(_newNodeT<ConstPoolNode>(out));
  return registerLabelNode(*out);
}